

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObject.cpp
# Opt level: O2

CK_ATTRIBUTE_TYPE __thiscall
SessionObject::nextAttributeType(SessionObject *this,CK_ATTRIBUTE_TYPE type)

{
  iterator iVar1;
  CK_ATTRIBUTE_TYPE CVar2;
  MutexLocker lock;
  MutexLocker MStack_28;
  CK_ATTRIBUTE_TYPE local_18;
  
  local_18 = type;
  MutexLocker::MutexLocker(&MStack_28,this->objectMutex);
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
          ::upper_bound(&(this->attributes)._M_t,&local_18);
  CVar2 = 0;
  do {
    if ((_Rb_tree_header *)iVar1._M_node == &(this->attributes)._M_t._M_impl.super__Rb_tree_header)
    {
LAB_00168053:
      MutexLocker::~MutexLocker(&MStack_28);
      return CVar2;
    }
    if (iVar1._M_node[1]._M_parent != (_Base_ptr)0x0) {
      CVar2 = *(CK_ATTRIBUTE_TYPE *)(iVar1._M_node + 1);
      goto LAB_00168053;
    }
    iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
  } while( true );
}

Assistant:

CK_ATTRIBUTE_TYPE SessionObject::nextAttributeType(CK_ATTRIBUTE_TYPE type)
{
	MutexLocker lock(objectMutex);

	std::map<CK_ATTRIBUTE_TYPE, OSAttribute*>::iterator n = attributes.upper_bound(type);

	// skip null attributes
	while ((n != attributes.end()) && (n->second == NULL))
		++n;


	// return type or CKA_CLASS (= 0)
	if (n == attributes.end())
	{
		return CKA_CLASS;
	}
	else
	{
		return n->first;
	}
}